

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_pool.cpp
# Opt level: O0

int __thiscall Mempool::get_list_size_byte(Mempool *this,MEM_CAP index)

{
  int iVar1;
  bool bVar2;
  mapped_type *ppCVar3;
  MEM_CAP local_54;
  mapped_type local_50;
  Chunk *node;
  MEM_CAP local_2c;
  _Node_iterator_base<std::pair<const_int,_Chunk_*>,_false> local_28;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> lck;
  int size;
  MEM_CAP index_local;
  Mempool *this_local;
  
  lck._M_device._0_4_ = 0;
  lck._M_device._4_4_ = index;
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->mp_mutex);
  local_2c = lck._M_device._4_4_;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<int,_Chunk_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_Chunk_*>_>_>
       ::find(&this->mp_pool,(key_type *)&local_2c);
  node = (Chunk *)std::
                  unordered_map<int,_Chunk_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_Chunk_*>_>_>
                  ::end(&this->mp_pool);
  bVar2 = std::__detail::operator==
                    (&local_28,(_Node_iterator_base<std::pair<const_int,_Chunk_*>,_false> *)&node);
  if (((bVar2 ^ 0xffU) & 1) == 0) {
    __assert_fail("mp_pool.find(index) != mp_pool.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/AlberTTreblA[P]HighPerformanceConcurrentServer/memory/mem_pool.cpp"
                  ,0x62,"int Mempool::get_list_size_byte(MEM_CAP)");
  }
  local_54 = lck._M_device._4_4_;
  ppCVar3 = std::
            unordered_map<int,_Chunk_*,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_Chunk_*>_>_>
            ::operator[](&this->mp_pool,(key_type *)&local_54);
  for (local_50 = *ppCVar3; iVar1 = (int)lck._M_device, local_50 != (mapped_type)0x0;
      local_50 = local_50->next) {
    lck._M_device._0_4_ = local_50->capacity + (int)lck._M_device;
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return iVar1;
}

Assistant:

int Mempool::get_list_size_byte(MEM_CAP index)
{
    int size = 0;
    lock_guard<mutex> lck(mp_mutex);
    assert(mp_pool.find(index) != mp_pool.end());
    Chunk *node = mp_pool[index];

    while(node)
    {
        size += node->capacity;
        node = node->next;
    } 

    return size;
}